

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O3

ostream * __thiscall dynamicgraph::Entity::writeCompletionList(Entity *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  string local_50;
  
  p_Var1 = &(this->signalMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->signalMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var1 != (_Rb_tree_header *)p_Var3) {
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      SignalBase<int>::shortName_abi_cxx11_(&local_50,*(SignalBase<int> **)(p_Var3 + 2));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var1 != (_Rb_tree_header *)p_Var3);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,Entity_COMMAND_LIST_abi_cxx11_._M_dataplus._M_p,
                      Entity_COMMAND_LIST_abi_cxx11_._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream &Entity::writeCompletionList(std::ostream &os) const {
  const SignalMap::const_iterator iterend = signalMap.end();
  for (SignalMap::const_iterator iter = signalMap.begin(); iterend != iter;
       ++iter) {
    os << getName() << "." << (*(iter->second)).shortName() << std::endl;
  }

  os << getCommandList() << std::endl;
  return os;
}